

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

DescriptorScriptPubKeyMan * __thiscall
wallet::CWallet::SetupDescriptorScriptPubKeyMan
          (CWallet *this,WalletBatch *batch,CExtKey *master_key,OutputType *output_type,
          bool internal)

{
  uint256 id_00;
  bool bVar1;
  int iVar2;
  DescriptorScriptPubKeyMan *this_00;
  runtime_error *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long in_FS_OFFSET;
  uint256 id;
  DescriptorScriptPubKeyMan *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (DescriptorScriptPubKeyMan *)operator_new(0x278);
  DescriptorScriptPubKeyMan::DescriptorScriptPubKeyMan
            (this_00,&this->super_WalletStorage,this->m_keypool_size);
  if ((this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    bVar1 = IsLocked(this);
    if (bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"SetupDescriptorScriptPubKeyMan","");
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_78,": Wallet is locked, cannot setup new descriptors");
      local_58.super_base_blob<256U>.m_data._M_elems._0_8_ = (pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.super_base_blob<256U>.m_data._M_elems._0_8_ == paVar5) {
        local_58.super_base_blob<256U>.m_data._M_elems._16_8_ = paVar5->_M_allocated_capacity;
        local_58.super_base_blob<256U>.m_data._M_elems._24_8_ =
             *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_58.super_base_blob<256U>.m_data._M_elems._0_8_ =
             local_58.super_base_blob<256U>.m_data._M_elems + 0x10;
      }
      else {
        local_58.super_base_blob<256U>.m_data._M_elems._16_8_ = paVar5->_M_allocated_capacity;
      }
      local_58.super_base_blob<256U>.m_data._M_elems._8_8_ = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(prVar3,(string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00c1c69f;
    }
    iVar2 = (*(this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[4])(this_00,&this->vMasterKey);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[5])
                        (this_00,&this->vMasterKey,batch);
      if ((char)iVar2 == '\0') {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"SetupDescriptorScriptPubKeyMan","");
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_78,": Could not encrypt new descriptors");
        local_58.super_base_blob<256U>.m_data._M_elems._0_8_ = (pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.super_base_blob<256U>.m_data._M_elems._0_8_ == paVar5) {
          local_58.super_base_blob<256U>.m_data._M_elems._16_8_ = paVar5->_M_allocated_capacity;
          local_58.super_base_blob<256U>.m_data._M_elems._24_8_ =
               *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_58.super_base_blob<256U>.m_data._M_elems._0_8_ =
               local_58.super_base_blob<256U>.m_data._M_elems + 0x10;
        }
        else {
          local_58.super_base_blob<256U>.m_data._M_elems._16_8_ = paVar5->_M_allocated_capacity;
        }
        local_58.super_base_blob<256U>.m_data._M_elems._8_8_ = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        std::runtime_error::runtime_error(prVar3,(string *)&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00c1c69f;
      }
    }
  }
  DescriptorScriptPubKeyMan::SetupDescriptorGeneration
            (this_00,batch,master_key,*output_type,internal);
  (*(this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&local_58,this_00);
  local_80 = this_00;
  AddScriptPubKeyMan(this,&local_58,
                     (unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                      )&local_80);
  if (local_80 != (DescriptorScriptPubKeyMan *)0x0) {
    (*(local_80->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[1])();
  }
  id_00.super_base_blob<256U>.m_data._M_elems[8] = local_58.super_base_blob<256U>.m_data._M_elems[8]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[9] = local_58.super_base_blob<256U>.m_data._M_elems[9]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[10] =
       local_58.super_base_blob<256U>.m_data._M_elems[10];
  id_00.super_base_blob<256U>.m_data._M_elems[0xb] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xb];
  id_00.super_base_blob<256U>.m_data._M_elems[0xc] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xc];
  id_00.super_base_blob<256U>.m_data._M_elems[0xd] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xd];
  id_00.super_base_blob<256U>.m_data._M_elems[0xe] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xe];
  id_00.super_base_blob<256U>.m_data._M_elems[0xf] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xf];
  id_00.super_base_blob<256U>.m_data._M_elems[0] = local_58.super_base_blob<256U>.m_data._M_elems[0]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[1] = local_58.super_base_blob<256U>.m_data._M_elems[1]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[2] = local_58.super_base_blob<256U>.m_data._M_elems[2]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[3] = local_58.super_base_blob<256U>.m_data._M_elems[3]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[4] = local_58.super_base_blob<256U>.m_data._M_elems[4]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[5] = local_58.super_base_blob<256U>.m_data._M_elems[5]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[6] = local_58.super_base_blob<256U>.m_data._M_elems[6]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[7] = local_58.super_base_blob<256U>.m_data._M_elems[7]
  ;
  id_00.super_base_blob<256U>.m_data._M_elems[0x10] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x10];
  id_00.super_base_blob<256U>.m_data._M_elems[0x11] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x11];
  id_00.super_base_blob<256U>.m_data._M_elems[0x12] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x12];
  id_00.super_base_blob<256U>.m_data._M_elems[0x13] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x13];
  id_00.super_base_blob<256U>.m_data._M_elems[0x14] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x14];
  id_00.super_base_blob<256U>.m_data._M_elems[0x15] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x15];
  id_00.super_base_blob<256U>.m_data._M_elems[0x16] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x16];
  id_00.super_base_blob<256U>.m_data._M_elems[0x17] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x17];
  id_00.super_base_blob<256U>.m_data._M_elems[0x18] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x18];
  id_00.super_base_blob<256U>.m_data._M_elems[0x19] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x19];
  id_00.super_base_blob<256U>.m_data._M_elems[0x1a] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1a];
  id_00.super_base_blob<256U>.m_data._M_elems[0x1b] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1b];
  id_00.super_base_blob<256U>.m_data._M_elems[0x1c] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1c];
  id_00.super_base_blob<256U>.m_data._M_elems[0x1d] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1d];
  id_00.super_base_blob<256U>.m_data._M_elems[0x1e] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1e];
  id_00.super_base_blob<256U>.m_data._M_elems[0x1f] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1f];
  AddActiveScriptPubKeyManWithDb(this,batch,id_00,*output_type,internal);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this_00;
  }
LAB_00c1c69f:
  __stack_chk_fail();
}

Assistant:

DescriptorScriptPubKeyMan& CWallet::SetupDescriptorScriptPubKeyMan(WalletBatch& batch, const CExtKey& master_key, const OutputType& output_type, bool internal)
{
    AssertLockHeld(cs_wallet);
    auto spk_manager = std::unique_ptr<DescriptorScriptPubKeyMan>(new DescriptorScriptPubKeyMan(*this, m_keypool_size));
    if (IsCrypted()) {
        if (IsLocked()) {
            throw std::runtime_error(std::string(__func__) + ": Wallet is locked, cannot setup new descriptors");
        }
        if (!spk_manager->CheckDecryptionKey(vMasterKey) && !spk_manager->Encrypt(vMasterKey, &batch)) {
            throw std::runtime_error(std::string(__func__) + ": Could not encrypt new descriptors");
        }
    }
    spk_manager->SetupDescriptorGeneration(batch, master_key, output_type, internal);
    DescriptorScriptPubKeyMan* out = spk_manager.get();
    uint256 id = spk_manager->GetID();
    AddScriptPubKeyMan(id, std::move(spk_manager));
    AddActiveScriptPubKeyManWithDb(batch, id, output_type, internal);
    return *out;
}